

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenTypeBasic_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,BaseType *type)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             GenTypeBasic::kotlin_typename
             [*(uint *)&(this->super_BaseGenerator)._vptr_BaseGenerator],&local_9);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenTypeBasic(const BaseType &type) {
    // clang-format off
    static const char * const kotlin_typename[] = {
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, \
              CTYPE, JTYPE, GTYPE, NTYPE, PTYPE, RTYPE, KTYPE, ...) \
        #KTYPE,
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
    };
    // clang-format on
    return kotlin_typename[type];
  }